

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_true>::unfix_
          (DaTrie<true,_true,_true> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  pointer pBVar6;
  pointer pBVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar10 = node_pos >> 8;
  pBVar6 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)(uVar10 << 4);
  if (*(int *)((long)&pBVar6->num_emps + uVar8) == 0) {
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7[node_pos] =
         (Bc)((ulong)pBVar7[node_pos] & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7[node_pos] =
         (Bc)((ulong)pBVar7[node_pos] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20)
    ;
    pBVar6 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)&pBVar6->next + (ulong)(uVar10 << 4));
    *(uint32_t *)((long)&pBVar6->head + (ulong)(uVar10 << 4)) = node_pos;
    uVar3 = this->head_pos_;
    uVar9 = (ulong)uVar3;
    if (uVar9 == 0xffffffff) {
      *puVar1 = uVar10;
      puVar1[1] = uVar10;
      this->head_pos_ = uVar10;
    }
    else {
      uVar4 = pBVar6[uVar9].prev;
      puVar1[1] = uVar4;
      *puVar1 = uVar3;
      pBVar6[uVar4].next = uVar10;
      pBVar6[uVar9].prev = uVar10;
    }
  }
  else {
    uVar3 = *(uint *)((long)&pBVar6->head + uVar8);
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7[node_pos] =
         (Bc)((ulong)pBVar7[node_pos] & 0x80000000ffffffff |
             (ulong)pBVar7[uVar3] & 0x7fffffff00000000);
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7[node_pos] =
         (Bc)((ulong)(uVar3 & 0x7fffffff) | (ulong)pBVar7[node_pos] & 0xffffffff00000000);
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)pBVar7[uVar3] >> 0x1d & 0x3fffffff8;
    *(ulong *)(&pBVar7->field_0x0 + uVar9) =
         *(ulong *)(&pBVar7->field_0x0 + uVar9) & 0xffffffff00000000 |
         (ulong)(node_pos & 0x7fffffff);
    pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar7[uVar3] =
         (Bc)((ulong)pBVar7[uVar3] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
  }
  pBVar7 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start + node_pos;
  *pBVar7 = (Bc)((ulong)*pBVar7 & 0x7fffffffffffffff);
  this->bc_emps_ = this->bc_emps_ + 1;
  piVar2 = (int *)((long)&((blocks->
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                           _M_impl.super__Vector_impl_data._M_start)->num_emps +
                  (ulong)(uVar10 << 4));
  *piVar2 = *piVar2 + 1;
  if (uVar10 == (int)((ulong)((long)(this->blocks_).
                                    super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->blocks_).
                                   super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1U) {
    uVar5 = *(uint32_t *)
             ((long)&((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                      _M_impl.super__Vector_impl_data._M_start)->num_emps + uVar8);
    while (uVar5 == 0x100) {
      uVar10 = uVar10 - 1;
      pop_block_(this);
      if ((int)((ulong)((long)(this->blocks_).
                              super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->blocks_).
                             super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) == 0) {
        return;
      }
      uVar5 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10].num_emps;
    }
  }
  return;
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (blocks[block_pos].num_emps == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      blocks[block_pos].head = node_pos;
      insert_block_link_(block_pos, blocks);
    } else {
      auto head = blocks[block_pos].head;
      set_prev_(node_pos, prev_(head));
      set_next_(node_pos, head);
      set_next_(prev_(head), node_pos);
      set_prev_(head, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }